

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcalendarwidget.cpp
# Opt level: O2

void QCalendarWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint *puVar1;
  bool bVar2;
  undefined1 uVar3;
  uint uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  SelectionMode *pSVar7;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      selectionChanged((QCalendarWidget *)_o);
      return;
    case 1:
      clicked((QCalendarWidget *)_o,(QDate)*_a[1]);
      return;
    case 2:
      activated((QCalendarWidget *)_o,(QDate)*_a[1]);
      return;
    case 3:
      currentPageChanged((QCalendarWidget *)_o,*_a[1],*_a[2]);
      return;
    case 4:
      pSVar7 = (SelectionMode *)_a[1];
switchD_003a9306_caseD_0:
      setSelectedDate((QCalendarWidget *)_o,(QDate)*(qint64 *)pSVar7);
      return;
    case 5:
      setDateRange((QCalendarWidget *)_o,(QDate)*_a[1],(QDate)*_a[2]);
      return;
    case 6:
      setCurrentPage((QCalendarWidget *)_o,*_a[1],*_a[2]);
      return;
    case 7:
      pSVar7 = (SelectionMode *)_a[1];
switchD_003a9306_caseD_4:
      setGridVisible((QCalendarWidget *)_o,SUB41(*pSVar7,0));
      return;
    case 8:
      pSVar7 = (SelectionMode *)_a[1];
switchD_003a9306_caseD_8:
      setNavigationBarVisible((QCalendarWidget *)_o,SUB41(*pSVar7,0));
      return;
    case 9:
      showNextMonth((QCalendarWidget *)_o);
      return;
    case 10:
      showPreviousMonth((QCalendarWidget *)_o);
      return;
    case 0xb:
      showNextYear((QCalendarWidget *)_o);
      return;
    case 0xc:
      showPreviousYear((QCalendarWidget *)_o);
      return;
    case 0xd:
      showSelectedDate((QCalendarWidget *)_o);
      return;
    case 0xe:
      showToday((QCalendarWidget *)_o);
      return;
    case 0xf:
      QCalendarWidgetPrivate::updateCurrentPage(*(QCalendarWidgetPrivate **)(_o + 8),(QDate)*_a[1]);
      return;
    case 0x10:
      QCalendarWidgetPrivate::_q_slotChangeDate(*(QCalendarWidgetPrivate **)(_o + 8),(QDate)*_a[1]);
      return;
    case 0x11:
      QCalendarWidgetPrivate::_q_slotChangeDate
                (*(QCalendarWidgetPrivate **)(_o + 8),(QDate)*_a[1],*_a[2]);
      return;
    case 0x12:
      QCalendarWidgetPrivate::_q_editingFinished(*(QCalendarWidgetPrivate **)(_o + 8));
      return;
    case 0x13:
      QCalendarWidgetPrivate::_q_prevMonthClicked(*(QCalendarWidgetPrivate **)(_o + 8));
      return;
    case 0x14:
      QCalendarWidgetPrivate::_q_nextMonthClicked(*(QCalendarWidgetPrivate **)(_o + 8));
      return;
    case 0x15:
      QCalendarWidgetPrivate::_q_yearEditingFinished(*(QCalendarWidgetPrivate **)(_o + 8));
      return;
    case 0x16:
      QCalendarWidgetPrivate::_q_yearClicked(*(QCalendarWidgetPrivate **)(_o + 8));
      return;
    case 0x17:
      QCalendarWidgetPrivate::_q_monthChanged(*(QCalendarWidgetPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (10 < (uint)_id) {
      return;
    }
    puVar1 = (uint *)*_a;
    switch(_id) {
    case 0:
      uVar6 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x20);
      goto LAB_003a949d;
    case 1:
      uVar6 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x28);
      goto LAB_003a949d;
    case 2:
      uVar6 = *(undefined8 *)(*(long *)(*(long *)(_o + 8) + 600) + 0x30);
LAB_003a949d:
      *(undefined8 *)puVar1 = uVar6;
      return;
    case 3:
      uVar4 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x40);
      break;
    case 4:
      uVar3 = isGridVisible((QCalendarWidget *)_o);
      goto LAB_003a94e2;
    case 5:
      uVar4 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x28) ^ 1;
      break;
    case 6:
      uVar4 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x44);
      break;
    case 7:
      uVar4 = (uint)*(byte *)(*(long *)(*(long *)(_o + 8) + 600) + 0x48);
      break;
    case 8:
      uVar3 = *(undefined1 *)(*(long *)(_o + 8) + 0x2d0);
      goto LAB_003a94e2;
    case 9:
      uVar3 = *(undefined1 *)(*(long *)(_o + 8) + 0x280);
LAB_003a94e2:
      *(undefined1 *)puVar1 = uVar3;
      return;
    case 10:
      uVar4 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x278) + 0x38);
    }
    *puVar1 = uVar4;
    break;
  case WriteProperty:
    if ((uint)_id < 0xb) {
      pSVar7 = (SelectionMode *)*_a;
      switch(_id) {
      case 0:
        goto switchD_003a9306_caseD_0;
      case 1:
        setMinimumDate((QCalendarWidget *)_o,(QDate)*(qint64 *)pSVar7);
        return;
      case 2:
        setMaximumDate((QCalendarWidget *)_o,(QDate)*(qint64 *)pSVar7);
        return;
      case 3:
        setFirstDayOfWeek((QCalendarWidget *)_o,*pSVar7);
        return;
      case 4:
        goto switchD_003a9306_caseD_4;
      case 5:
        setSelectionMode((QCalendarWidget *)_o,*pSVar7);
        return;
      case 6:
        setHorizontalHeaderFormat((QCalendarWidget *)_o,*pSVar7);
        return;
      case 7:
        setVerticalHeaderFormat((QCalendarWidget *)_o,*pSVar7);
        return;
      case 8:
        goto switchD_003a9306_caseD_8;
      case 9:
        setDateEditEnabled((QCalendarWidget *)_o,SUB41(*pSVar7,0));
        return;
      case 10:
        *(SelectionMode *)(*(long *)(*(long *)(_o + 8) + 0x278) + 0x38) = *pSVar7;
      }
    }
    break;
  case ResetProperty:
    if (_id == 2) {
      clearMaximumDate((QCalendarWidget *)_o);
      return;
    }
    if (_id == 1) {
      clearMinimumDate((QCalendarWidget *)_o);
      return;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QCalendarWidget::*)()>
                      ((QtMocHelpers *)_a,(void **)selectionChanged,0,0);
    if (((!bVar2) &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QCalendarWidget::*)(QDate)>
                           ((QtMocHelpers *)_a,(void **)clicked,0,1), !bVar2)) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QCalendarWidget::*)(QDate)>
                          ((QtMocHelpers *)_a,(void **)activated,0,2), !bVar2)) {
      QtMocHelpers::indexOfMethod<void(QCalendarWidget::*)(int,int)>
                ((QtMocHelpers *)_a,(void **)currentPageChanged,0,3);
      return;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 0x17) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        return;
      }
    }
    else {
      puVar5 = (undefined8 *)*_a;
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void QCalendarWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCalendarWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectionChanged(); break;
        case 1: _t->clicked((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 2: _t->activated((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->currentPageChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->setSelectedDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setDateRange((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDate>>(_a[2]))); break;
        case 6: _t->setCurrentPage((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 7: _t->setGridVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setNavigationBarVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 9: _t->showNextMonth(); break;
        case 10: _t->showPreviousMonth(); break;
        case 11: _t->showNextYear(); break;
        case 12: _t->showPreviousYear(); break;
        case 13: _t->showSelectedDate(); break;
        case 14: _t->showToday(); break;
        case 15: _t->d_func()->_q_slotShowDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 16: _t->d_func()->_q_slotChangeDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 17: _t->d_func()->_q_slotChangeDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 18: _t->d_func()->_q_editingFinished(); break;
        case 19: _t->d_func()->_q_prevMonthClicked(); break;
        case 20: _t->d_func()->_q_nextMonthClicked(); break;
        case 21: _t->d_func()->_q_yearEditingFinished(); break;
        case 22: _t->d_func()->_q_yearClicked(); break;
        case 23: _t->d_func()->_q_monthChanged((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 23:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)()>(_a, &QCalendarWidget::selectionChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(QDate )>(_a, &QCalendarWidget::clicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(QDate )>(_a, &QCalendarWidget::activated, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(int , int )>(_a, &QCalendarWidget::currentPageChanged, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDate*>(_v) = _t->selectedDate(); break;
        case 1: *reinterpret_cast<QDate*>(_v) = _t->minimumDate(); break;
        case 2: *reinterpret_cast<QDate*>(_v) = _t->maximumDate(); break;
        case 3: *reinterpret_cast<Qt::DayOfWeek*>(_v) = _t->firstDayOfWeek(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isGridVisible(); break;
        case 5: *reinterpret_cast<SelectionMode*>(_v) = _t->selectionMode(); break;
        case 6: *reinterpret_cast<HorizontalHeaderFormat*>(_v) = _t->horizontalHeaderFormat(); break;
        case 7: *reinterpret_cast<VerticalHeaderFormat*>(_v) = _t->verticalHeaderFormat(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isNavigationBarVisible(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isDateEditEnabled(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->dateEditAcceptDelay(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSelectedDate(*reinterpret_cast<QDate*>(_v)); break;
        case 1: _t->setMinimumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 2: _t->setMaximumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 3: _t->setFirstDayOfWeek(*reinterpret_cast<Qt::DayOfWeek*>(_v)); break;
        case 4: _t->setGridVisible(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setSelectionMode(*reinterpret_cast<SelectionMode*>(_v)); break;
        case 6: _t->setHorizontalHeaderFormat(*reinterpret_cast<HorizontalHeaderFormat*>(_v)); break;
        case 7: _t->setVerticalHeaderFormat(*reinterpret_cast<VerticalHeaderFormat*>(_v)); break;
        case 8: _t->setNavigationBarVisible(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setDateEditEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setDateEditAcceptDelay(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->clearMinimumDate(); break;
        case 2: _t->clearMaximumDate(); break;
        default: break;
        }
    }
}